

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall EventLoop::handleRead(EventLoop *this)

{
  char *pcVar1;
  ssize_t v;
  LogStream *pLVar2;
  char **ppcVar3;
  Logger local_ff0;
  undefined8 local_18;
  uint64_t one;
  
  local_18 = 1;
  v = read(this->wakeupFd_,&local_18,8);
  if (v != 8) {
    Logger::Logger(&local_ff0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                   ,0x76);
    if (0x24 < ((int)&local_ff0 + 0xfa8) - (int)local_ff0.impl_.stream_.buffer_.cur_) {
      builtin_strncpy(local_ff0.impl_.stream_.buffer_.cur_,"Error: EventLoop::handleRead() reads",
                      0x24);
      local_ff0.impl_.stream_.buffer_.cur_ = local_ff0.impl_.stream_.buffer_.cur_ + 0x24;
    }
    pLVar2 = LogStream::operator<<((LogStream *)&local_ff0,v);
    ppcVar3 = &(pLVar2->buffer_).cur_;
    pcVar1 = (pLVar2->buffer_).cur_;
    if (0x13 < (int)ppcVar3 - (int)pcVar1) {
      builtin_strncpy(pcVar1," bytes instead of 8",0x13);
      *ppcVar3 = *ppcVar3 + 0x13;
    }
    Logger::~Logger(&local_ff0);
  }
  return;
}

Assistant:

void EventLoop::handleRead() {
    uint64_t one = 1;
    ssize_t n = read(wakeupFd_, &one, sizeof one);
    if (n != sizeof one) {
        LOG << "Error: EventLoop::handleRead() reads" << n << " bytes instead of 8";
    }
}